

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

void upb_Message_DeleteUnknown(upb_Message *msg,char *data,size_t len)

{
  char *__src;
  ulong uVar1;
  char *pcVar2;
  uint uVar3;
  long lVar4;
  upb_Message_Internal *in;
  
  uVar1 = (msg->field_0).internal_opaque;
  if ((uVar1 & 1) != 0) {
    __assert_fail("!upb_Message_IsFrozen(msg)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/message/message.c"
                  ,0x43,"void upb_Message_DeleteUnknown(upb_Message *, const char *, size_t)");
  }
  uVar3 = *(uint *)(uVar1 + 4);
  if (uVar1 == 0) {
    pcVar2 = (char *)0x0;
    lVar4 = 0;
  }
  else {
    pcVar2 = (char *)(uVar1 + 0xc);
    if (data < pcVar2) {
      __assert_fail("(uintptr_t)data >= (uintptr_t)full_unknown",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/message/message.c"
                    ,0x4a,"void upb_Message_DeleteUnknown(upb_Message *, const char *, size_t)");
    }
    lVar4 = (ulong)uVar3 - 0xc;
  }
  if (pcVar2 + lVar4 <= data) {
    __assert_fail("(uintptr_t)data < (uintptr_t)(full_unknown + full_unknown_size)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/message/message.c"
                  ,0x4b,"void upb_Message_DeleteUnknown(upb_Message *, const char *, size_t)");
  }
  if ((long)len < 1) {
    __assert_fail("(uintptr_t)(data + len) > (uintptr_t)data",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/message/message.c"
                  ,0x4c,"void upb_Message_DeleteUnknown(upb_Message *, const char *, size_t)");
  }
  pcVar2 = (char *)(uVar1 + uVar3);
  __src = data + len;
  if (__src < pcVar2 || __src == pcVar2) {
    if (__src != pcVar2) {
      memmove(data,__src,(long)pcVar2 - (long)__src);
      uVar3 = *(uint *)(uVar1 + 4);
    }
    *(uint *)(uVar1 + 4) = uVar3 - (int)len;
    return;
  }
  __assert_fail("(uintptr_t)(data + len) <= (uintptr_t)internal_unknown_end",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/message/message.c"
                ,0x4d,"void upb_Message_DeleteUnknown(upb_Message *, const char *, size_t)");
}

Assistant:

void upb_Message_DeleteUnknown(upb_Message* msg, const char* data, size_t len) {
  UPB_ASSERT(!upb_Message_IsFrozen(msg));
  upb_Message_Internal* in = UPB_PRIVATE(_upb_Message_GetInternal)(msg);
  const char* internal_unknown_end = UPB_PTR_AT(in, in->unknown_end, char);

#ifndef NDEBUG
  size_t full_unknown_size;
  const char* full_unknown = upb_Message_GetUnknown(msg, &full_unknown_size);
  UPB_ASSERT((uintptr_t)data >= (uintptr_t)full_unknown);
  UPB_ASSERT((uintptr_t)data < (uintptr_t)(full_unknown + full_unknown_size));
  UPB_ASSERT((uintptr_t)(data + len) > (uintptr_t)data);
  UPB_ASSERT((uintptr_t)(data + len) <= (uintptr_t)internal_unknown_end);
#endif

  if ((data + len) != internal_unknown_end) {
    memmove((char*)data, data + len, internal_unknown_end - data - len);
  }
  in->unknown_end -= len;
}